

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

int main(void)

{
  int iVar1;
  GLFWwindow *pGVar2;
  GLFWwindow *pGStack_98;
  int count;
  Thread threads [3];
  int local_14;
  int local_10;
  int result;
  int i;
  
  result = 0;
  memcpy(&stack0xffffffffffffff68,&DAT_00135c60,0x78);
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  glfwWindowHint(0x20004,0);
  local_10 = 0;
  while( true ) {
    if (2 < local_10) {
      glfwMakeContextCurrent(pGStack_98);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwMakeContextCurrent((GLFWwindow *)0x0);
      local_10 = 0;
      while( true ) {
        if (2 < local_10) {
          while (running != 0) {
            glfwWaitEvents();
            for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
              iVar1 = glfwWindowShouldClose((GLFWwindow *)threads[(long)local_10 + -1].id);
              if (iVar1 != 0) {
                running = 0;
              }
            }
          }
          for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
            glfwHideWindow((GLFWwindow *)threads[(long)local_10 + -1].id);
          }
          for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
            thrd_join(*(thrd_t *)&threads[local_10].b,&local_14);
          }
          exit(0);
        }
        iVar1 = thrd_create((thrd_t *)&threads[local_10].b,thread_main,
                            &threads[(long)local_10 + -1].id);
        if (iVar1 != 1) break;
        local_10 = local_10 + 1;
      }
      fprintf(_stderr,"Failed to create secondary thread\n");
      glfwTerminate();
      exit(1);
    }
    pGVar2 = glfwCreateWindow(200,200,(char *)threads[local_10].window,(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    threads[(long)local_10 + -1].id = (thrd_t)pGVar2;
    if (threads[(long)local_10 + -1].id == 0) break;
    glfwSetWindowPos((GLFWwindow *)threads[(long)local_10 + -1].id,local_10 * 0xfa + 200,200);
    glfwShowWindow((GLFWwindow *)threads[(long)local_10 + -1].id);
    local_10 = local_10 + 1;
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(void)
{
    int i, result;
    Thread threads[] =
    {
        { NULL, "Red", 1.f, 0.f, 0.f, 0 },
        { NULL, "Green", 0.f, 1.f, 0.f, 0 },
        { NULL, "Blue", 0.f, 0.f, 1.f, 0 }
    };
    const int count = sizeof(threads) / sizeof(Thread);

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

    for (i = 0;  i < count;  i++)
    {
        threads[i].window = glfwCreateWindow(200, 200,
                                             threads[i].title,
                                             NULL, NULL);
        if (!threads[i].window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetWindowPos(threads[i].window, 200 + 250 * i, 200);
        glfwShowWindow(threads[i].window);
    }

    glfwMakeContextCurrent(threads[0].window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwMakeContextCurrent(NULL);

    for (i = 0;  i < count;  i++)
    {
        if (thrd_create(&threads[i].id, thread_main, threads + i) !=
            thrd_success)
        {
            fprintf(stderr, "Failed to create secondary thread\n");

            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    while (running)
    {
        glfwWaitEvents();

        for (i = 0;  i < count;  i++)
        {
            if (glfwWindowShouldClose(threads[i].window))
                running = GLFW_FALSE;
        }
    }

    for (i = 0;  i < count;  i++)
        glfwHideWindow(threads[i].window);

    for (i = 0;  i < count;  i++)
        thrd_join(threads[i].id, &result);

    exit(EXIT_SUCCESS);
}